

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void tlstran_pipe_recv_start(tlstran_pipe *p)

{
  undefined1 local_28 [8];
  nni_iov iov;
  
  if (p->rxmsg != (nni_msg *)0x0) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/tls/tls.c"
              ,0x1fa,"p->rxmsg == NULL");
  }
  local_28 = (undefined1  [8])p->rxlen;
  iov.iov_buf = (void *)0x8;
  nni_aio_set_iov(&p->rxaio,1,(nni_iov *)local_28);
  nng_stream_recv(p->tls,&p->rxaio);
  return;
}

Assistant:

static void
tlstran_pipe_recv_start(tlstran_pipe *p)
{
	nni_aio *aio;
	nni_iov  iov;
	NNI_ASSERT(p->rxmsg == NULL);

	// Schedule a read of the IPC header.
	aio         = &p->rxaio;
	iov.iov_buf = p->rxlen;
	iov.iov_len = sizeof(p->rxlen);
	nni_aio_set_iov(aio, 1, &iov);

	nng_stream_recv(p->tls, aio);
}